

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int i;
  int n;
  int r;
  int d;
  vector<int,_std::allocator<int>_> evening;
  vector<int,_std::allocator<int>_> morning;
  int temp;
  uint local_84;
  int local_80;
  int local_7c;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  value_type_conflict1 local_34;
  
  while( true ) {
    iVar1 = __isoc99_scanf("%d %d %d",&local_84,&local_7c,&local_80);
    if ((((iVar1 == 0) || (local_84 == 0)) || (local_7c == 0)) || (local_80 == 0)) break;
    local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_58,(ulong)local_84);
    for (iVar1 = 0; iVar1 < (int)local_84; iVar1 = iVar1 + 1) {
      __isoc99_scanf("%d",&local_34);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_58,&local_34);
    }
    local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)&local_78,(long)(int)local_84);
    for (iVar1 = 0; iVar1 < (int)local_84; iVar1 = iVar1 + 1) {
      __isoc99_scanf("%d",&local_34);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_78,&local_34);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58._M_impl.super__Vector_impl_data._M_start,
               local_58._M_impl.super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<void>>>
              (local_78._M_impl.super__Vector_impl_data._M_start,
               local_78._M_impl.super__Vector_impl_data._M_finish);
    uVar3 = 0;
    uVar2 = (ulong)local_84;
    if ((int)local_84 < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = (local_78._M_impl.super__Vector_impl_data._M_start[uVar3] +
              local_58._M_impl.super__Vector_impl_data._M_start[uVar3]) - local_7c;
      if (iVar4 == 0 ||
          local_78._M_impl.super__Vector_impl_data._M_start[uVar3] +
          local_58._M_impl.super__Vector_impl_data._M_start[uVar3] < local_7c) {
        iVar4 = 0;
      }
      iVar1 = iVar1 + iVar4;
    }
    printf("%d\n",(ulong)(uint)(iVar1 * local_80));
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  }
  return 0;
}

Assistant:

int main(){
    int n,d,r,temp;
    while (scanf("%d %d %d", &n, &d, &r) && n && d && r){
        vector<int> morning;
        morning.reserve(static_cast<unsigned int>(n));

        for (int i = 0; i < n; ++i) {
            scanf("%d",&temp);
            morning.push_back(temp);
        }
        vector<int> evening;
        evening.reserve(n);
        for (int j = 0; j < n; ++j) {
            scanf("%d",&temp);
            evening.push_back(temp);
        }

        sort(morning.begin(),morning.end());
        sort(evening.begin(),evening.end(), greater<>());
        int totalCost = 0;
        for (int k = 0; k < n; ++k) {
            int cost = morning[k] + evening[k];
            if (cost > d){
                totalCost += cost-d;
            }
        }
        totalCost *= r;
        printf("%d\n",totalCost);

    }
    return 0;
}